

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
dg::vr::StructureAnalyzer::getInvalidatedAreas
          (StructureAnalyzer *this,
          vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
          *instructions)

{
  bool bVar1;
  undefined8 in_RDX;
  size_type in_RSI;
  VRCodeGraph *in_RDI;
  VRInstruction vrinst;
  VRLocation *location;
  Instruction *inst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *__range2;
  vector<bool,_std::allocator<bool>_> *validAreas;
  VRInstruction *in_stack_00000128;
  vector<bool,_std::allocator<bool>_> *in_stack_00000130;
  VRLocation *in_stack_00000138;
  StructureAnalyzer *in_stack_00000140;
  allocator_type *in_stack_ffffffffffffff78;
  VRCodeGraph *this_00;
  __normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_>::size
            ((vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_> *)
             (in_RSI + 0xb8));
  local_1a = 1;
  std::allocator<bool>::allocator((allocator<bool> *)0x1f0565);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)this_00,in_RSI,(bool *)in_RDI,
             in_stack_ffffffffffffff78);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1f0588);
  local_28 = local_18;
  local_30._M_current =
       (Instruction **)
       std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>::begin
                 ((vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *)
                  in_stack_ffffffffffffff78);
  std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>::end
            ((vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *)
             in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
    ::operator*(&local_30);
    VRCodeGraph::getVRLocation(in_RDI,(Instruction *)in_stack_ffffffffffffff78);
    VRInstruction::VRInstruction((VRInstruction *)in_RDI,(Instruction *)in_stack_ffffffffffffff78);
    setValidAreasByInstruction
              (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128);
    VRInstruction::~VRInstruction((VRInstruction *)0x1f0624);
    __gnu_cxx::
    __normal_iterator<const_llvm::Instruction_*const_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>
    ::operator++(&local_30);
  }
  return (vector<bool,_std::allocator<bool>_> *)in_RDI;
}

Assistant:

std::vector<bool> StructureAnalyzer::getInvalidatedAreas(
        const std::vector<const llvm::Instruction *> &instructions) const {
    std::vector<bool> validAreas(allocatedAreas.size(), true);

    for (const llvm::Instruction *inst : instructions) {
        VRLocation &location = codeGraph.getVRLocation(inst);
        VRInstruction vrinst(inst);

        setValidAreasByInstruction(location, validAreas, &vrinst);
    }
    return validAreas;
}